

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O3

size_t mpack_expect_ext_buf(mpack_reader_t *reader,int8_t *type,char *buf,size_t bufsize)

{
  ulong __n;
  mpack_tag_t mVar1;
  
  mVar1 = mpack_read_tag(reader);
  if (mVar1.type == mpack_type_ext) {
    *type = mVar1.v._0_1_;
  }
  if (reader->error == mpack_ok) {
    __n = mVar1.v.u >> 0x20;
    if (__n <= bufsize) {
      if ((ulong)((long)reader->end - (long)reader->data) < __n) {
        mpack_read_native_straddle(reader,buf,__n);
      }
      else {
        memcpy(buf,reader->data,__n);
        reader->data = reader->data + __n;
      }
      if (reader->error != mpack_ok) {
        return 0;
      }
      return __n;
    }
    reader->error = mpack_error_too_big;
    reader->end = reader->data;
    if (reader->error_fn != (mpack_reader_error_t)0x0) {
      (*reader->error_fn)(reader,mpack_error_too_big);
    }
  }
  return 0;
}

Assistant:

size_t mpack_expect_ext_buf(mpack_reader_t* reader, int8_t* type, char* buf, size_t bufsize) {
    mpack_assert(buf != NULL, "buf cannot be NULL");

    size_t extsize = mpack_expect_ext(reader, type);
    if (mpack_reader_error(reader))
        return 0;
    if (extsize > bufsize) {
        mpack_reader_flag_error(reader, mpack_error_too_big);
        return 0;
    }
    mpack_read_bytes(reader, buf, extsize);
    if (mpack_reader_error(reader))
        return 0;
    mpack_done_ext(reader);
    return extsize;
}